

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkOptionsCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetLinkOptionsCommand::HandleDirectContent
          (cmTargetLinkOptionsCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  cmListFileBacktrace lfbt;
  undefined1 local_50 [16];
  string local_40;
  
  cmMakefile::GetBacktrace((cmMakefile *)local_50);
  (*(this->super_cmTargetPropCommandBase).super_cmCommand._vptr_cmCommand[10])
            (&local_40,this,content);
  cmTarget::InsertLinkOption(tgt,&local_40,(cmListFileBacktrace *)local_50,prepend);
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  return true;
}

Assistant:

bool cmTargetLinkOptionsCommand::HandleDirectContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend, bool)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  tgt->InsertLinkOption(this->Join(content), lfbt, prepend);
  return true; // Successfully handled.
}